

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathSetFrame(xmlXPathParserContextPtr ctxt)

{
  int ret;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    ctxt_local._4_4_ = ctxt->valueFrame;
    ctxt->valueFrame = ctxt->valueNr;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathSetFrame(xmlXPathParserContextPtr ctxt) {
    int ret;

    if (ctxt == NULL)
        return(0);
    ret = ctxt->valueFrame;
    ctxt->valueFrame = ctxt->valueNr;
    return(ret);
}